

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_cid.c
# Opt level: O0

int quicly_remote_cid_unregister(quicly_remote_cid_set_t *set,uint64_t sequence)

{
  long in_RSI;
  int *in_RDI;
  size_t i;
  size_t min_seq_idx;
  uint64_t min_seq;
  size_t in_stack_ffffffffffffffc8;
  quicly_remote_cid_set_t *set_00;
  quicly_remote_cid_set_t *local_28;
  ulong local_20;
  int local_4;
  
  local_20 = 0xffffffffffffffff;
  local_28 = (quicly_remote_cid_set_t *)0xffffffffffffffff;
  set_00 = (quicly_remote_cid_set_t *)0x0;
  do {
    if ((quicly_remote_cid_set_t *)0x3 < set_00) {
      if (*in_RDI == 0) {
        if (local_28 != (quicly_remote_cid_set_t *)0xffffffffffffffff) {
          promote_cid(set_00,in_stack_ffffffffffffffc8);
        }
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
      return local_4;
    }
    if (in_RSI == *(long *)(in_RDI + (long)set_00 * 0xe + 2)) {
      do_unregister(set_00,in_stack_ffffffffffffffc8);
      if (set_00 != (quicly_remote_cid_set_t *)0x0) {
        return 0;
      }
      set_00 = (quicly_remote_cid_set_t *)0x0;
    }
    if ((in_RDI[(long)set_00 * 0xe] != 0) &&
       (*(ulong *)(in_RDI + (long)set_00 * 0xe + 2) < local_20)) {
      local_20 = *(ulong *)(in_RDI + (long)set_00 * 0xe + 2);
      local_28 = set_00;
    }
    set_00 = (quicly_remote_cid_set_t *)((long)&set_00->cids[0].is_active + 1);
  } while( true );
}

Assistant:

int quicly_remote_cid_unregister(quicly_remote_cid_set_t *set, uint64_t sequence)
{
    uint64_t min_seq = UINT64_MAX;
    size_t min_seq_idx = SIZE_MAX;
    for (size_t i = 0; i < PTLS_ELEMENTSOF(set->cids); i++) {
        if (sequence == set->cids[i].sequence) {
            do_unregister(set, i);
            if (i != 0)
                return 0; /* if not retiring idx=0 (current in-use CID), simply return */
        }
        if (set->cids[i].is_active && min_seq > set->cids[i].sequence) {
            /* find a CID with minimum sequence number, while iterating over the array */
            min_seq = set->cids[i].sequence;
            min_seq_idx = i;
        }
    }

    if (!set->cids[0].is_active) {
        /* we have retired the current CID (idx=0) */
        if (min_seq_idx != SIZE_MAX)
            promote_cid(set, min_seq_idx);
        return 0;
    } else {
        /* we did not unregister any slot */
        return 1;
    }
}